

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O1

err_t dstuKeypairGen(octet *privkey,octet *pubkey,dstu_params *params,gen_i rng,void *rng_state)

{
  word *pwVar1;
  word *stack;
  qr_o *pqVar2;
  ec_o *peVar3;
  octet *poVar4;
  word *b;
  err_t eVar5;
  bool_t bVar6;
  size_t sVar7;
  ulong count;
  ulong n;
  word *a;
  ec_o *ec;
  ec_o *local_60;
  octet *local_58;
  size_t local_50;
  word *local_48;
  ec_o *local_40;
  octet *local_38;
  
  local_60 = (ec_o *)0x0;
  if (rng == (gen_i)0x0) {
    eVar5 = 0x130;
  }
  else {
    eVar5 = dstuEcCreate(&local_60,params,dstuKeypairGen_deep);
    peVar3 = local_60;
    if (eVar5 == 0) {
      sVar7 = wwBitSize(local_60->order,local_60->f->n);
      count = sVar7 + 7 >> 3;
      local_38 = privkey;
      bVar6 = memIsValid(privkey,count);
      if ((bVar6 != 0) && (bVar6 = memIsValid(pubkey,peVar3->f->no * 2), bVar6 != 0)) {
        n = sVar7 + 0x3f >> 6;
        a = (word *)((long)&(peVar3->hdr).keep + (peVar3->hdr).keep);
        local_40 = peVar3;
        local_50 = peVar3->f->n;
        local_48 = a + local_50;
        pwVar1 = local_48 + local_50;
        local_58 = pubkey;
        wwSetZero(a,n);
        do {
          (*rng)(a,count,rng_state);
          u64From(a,a,count);
          wwTrimHi(a,n,sVar7 - 1);
          bVar6 = wwIsZero(a,n);
          peVar3 = local_40;
          b = local_48;
        } while (bVar6 != 0);
        stack = pwVar1 + local_50;
        bVar6 = ecMulA(local_48,local_40->base,local_40,a,n,stack);
        if (bVar6 != 0) {
          ec2NegA(b,b,peVar3);
          u64To(local_38,count,a);
          poVar4 = local_58;
          (*peVar3->f->to)(local_58,b,peVar3->f,stack);
          pqVar2 = peVar3->f;
          (*pqVar2->to)(poVar4 + pqVar2->no,pwVar1,pqVar2,stack);
          blobClose(peVar3);
          return 0;
        }
        blobClose(peVar3);
        return 0x1f6;
      }
      blobClose(peVar3);
      eVar5 = 0x6d;
    }
  }
  return eVar5;
}

Assistant:

err_t dstuKeypairGen(octet privkey[], octet pubkey[], 
	const dstu_params* params, gen_i rng, void* rng_state)
{
	err_t code;
	size_t order_n, order_no, order_nb;
	// состояние
	ec_o* ec = 0;
	word* d;
	word* x;
	word* y;
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = dstuEcCreate(&ec, params, dstuKeypairGen_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	order_nb = wwBitSize(ec->order, ec->f->n);
	order_no = O_OF_B(order_nb);
	order_n = W_OF_B(order_nb);
	// проверить входные указатели
	if (!memIsValid(privkey, order_no) || 
		!memIsValid(pubkey, 2 * ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	x = d + ec->f->n;
	y = x + ec->f->n;
	stack = y + ec->f->n;
	// d <-R {1,2,..., order - 1}
	// [алгоритм из раздела 6.3 ДСТУ --- обрезка d]
	wwSetZero(d, order_n);
	while (1)
	{
		rng(d, O_OF_B(order_nb), rng_state);
		wwFrom(d, d, O_OF_B(order_nb));
		wwTrimHi(d, order_n, order_nb - 1);
		ASSERT(wwCmp(d, ec->order, order_n) < 0);
		// 0 < d?
		if (!wwIsZero(d, order_n))
			break;
	}
	// Q <- d G
	if (!ecMulA(x, ec->base, ec, d, order_n, stack))
	{
		// если params корректны, то этого быть не должно
		dstuEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// Q <- -Q
	ec2NegA(x, x, ec);
	// выгрузить ключи
	wwTo(privkey, order_no, d);
	qrTo(pubkey, x, ec->f, stack);
	qrTo(pubkey + ec->f->no, y, ec->f, stack);
	// все нормально
	dstuEcClose(ec);
	return code;
}